

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_data_collection_scanner.cpp
# Opt level: O3

void __thiscall
duckdb::RowDataCollectionScanner::SwizzleBlock(RowDataCollectionScanner *this,idx_t block_idx)

{
  reference pvVar1;
  pointer pRVar2;
  BlockHandle *pBVar3;
  type data_block;
  type heap_block;
  
  if ((this->rows->count != 0) && (this->unswizzling == true)) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::operator[](&this->rows->blocks,block_idx);
    pRVar2 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar1);
    if ((pRVar2->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      pRVar2 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(pvVar1);
      pBVar3 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pRVar2->block);
      if (pBVar3->unswizzled != (char *)0x0) {
        data_block = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                     ::operator*(pvVar1);
        pvVar1 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::operator[](&this->heap->blocks,block_idx);
        heap_block = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                     ::operator*(pvVar1);
        SwizzleBlockInternal(this,data_block,heap_block);
        return;
      }
    }
  }
  return;
}

Assistant:

void RowDataCollectionScanner::SwizzleBlock(idx_t block_idx) {
	if (rows.count == 0) {
		return;
	}

	if (!unswizzling) {
		// No swizzled blocks!
		return;
	}

	auto &data_block = rows.blocks[block_idx];
	if (data_block->block && !data_block->block->IsSwizzled()) {
		SwizzleBlockInternal(*data_block, *heap.blocks[block_idx]);
	}
}